

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PromoteSegments(Fts3Table *p,sqlite3_int64 iAbsLevel,sqlite3_int64 nByte)

{
  bool bVar1;
  sqlite3_stmt *psVar2;
  i64 p_00;
  bool bVar3;
  int iVar4;
  int iValue;
  long in_FS_OFFSET;
  sqlite3_stmt *pUpdate2;
  i64 nSize;
  sqlite3_stmt *pRange;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRange = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  iVar4 = fts3SqlStmt(p,0x25,&pRange,(sqlite3_value **)0x0);
  psVar2 = pRange;
  if (iVar4 == 0) {
    sqlite3_bind_int64(pRange,1,iAbsLevel + 1);
    sqlite3_bind_int64(psVar2,2,(iAbsLevel / 0x400) * 0x400 + 0x3ff);
    bVar3 = false;
    while (bVar1 = bVar3, iVar4 = sqlite3_step(psVar2), iVar4 == 100) {
      nSize = 0;
      fts3ReadEndBlockField(psVar2,2,(i64 *)&pUpdate2,&nSize);
      bVar1 = false;
      if ((nSize < 1) || (bVar3 = true, (nByte * 3) / 2 < nSize)) break;
    }
    iVar4 = sqlite3_reset(psVar2);
    if (bVar1) {
      nSize = 0;
      pUpdate2 = (sqlite3_stmt *)0x0;
      if ((iVar4 == 0) &&
         (iVar4 = fts3SqlStmt(p,0x26,(sqlite3_stmt **)&nSize,(sqlite3_value **)0x0), iVar4 == 0)) {
        iVar4 = fts3SqlStmt(p,0x27,&pUpdate2,(sqlite3_value **)0x0);
        if (iVar4 == 0) {
          sqlite3_bind_int64(psVar2,1,iAbsLevel);
          p_00 = nSize;
          iValue = 0;
          do {
            iVar4 = sqlite3_step(psVar2);
            if (iVar4 != 100) {
              iVar4 = sqlite3_reset(psVar2);
              psVar2 = pUpdate2;
              if (iVar4 == 0) {
                sqlite3_bind_int64(pUpdate2,1,iAbsLevel);
                sqlite3_step(psVar2);
                iVar4 = sqlite3_reset(psVar2);
              }
              goto LAB_001b635e;
            }
            sqlite3_bind_int((sqlite3_stmt *)p_00,1,iValue);
            iVar4 = sqlite3_column_int(psVar2,0);
            sqlite3_bind_int((sqlite3_stmt *)p_00,2,iVar4);
            iVar4 = sqlite3_column_int(psVar2,1);
            sqlite3_bind_int((sqlite3_stmt *)p_00,3,iVar4);
            sqlite3_step((sqlite3_stmt *)p_00);
            iVar4 = sqlite3_reset((sqlite3_stmt *)p_00);
            iValue = iValue + 1;
          } while (iVar4 == 0);
          sqlite3_reset(psVar2);
        }
      }
    }
  }
LAB_001b635e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts3PromoteSegments(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level just updated */
  sqlite3_int64 nByte             /* Size of new segment at iAbsLevel */
){
  int rc = SQLITE_OK;
  sqlite3_stmt *pRange;

  rc = fts3SqlStmt(p, SQL_SELECT_LEVEL_RANGE2, &pRange, 0);

  if( rc==SQLITE_OK ){
    int bOk = 0;
    i64 iLast = (iAbsLevel/FTS3_SEGDIR_MAXLEVEL + 1) * FTS3_SEGDIR_MAXLEVEL - 1;
    i64 nLimit = (nByte*3)/2;

    /* Loop through all entries in the %_segdir table corresponding to
    ** segments in this index on levels greater than iAbsLevel. If there is
    ** at least one such segment, and it is possible to determine that all
    ** such segments are smaller than nLimit bytes in size, they will be
    ** promoted to level iAbsLevel.  */
    sqlite3_bind_int64(pRange, 1, iAbsLevel+1);
    sqlite3_bind_int64(pRange, 2, iLast);
    while( SQLITE_ROW==sqlite3_step(pRange) ){
      i64 nSize = 0, dummy;
      fts3ReadEndBlockField(pRange, 2, &dummy, &nSize);
      if( nSize<=0 || nSize>nLimit ){
        /* If nSize==0, then the %_segdir.end_block field does not not
        ** contain a size value. This happens if it was written by an
        ** old version of FTS. In this case it is not possible to determine
        ** the size of the segment, and so segment promotion does not
        ** take place.  */
        bOk = 0;
        break;
      }
      bOk = 1;
    }
    rc = sqlite3_reset(pRange);

    if( bOk ){
      int iIdx = 0;
      sqlite3_stmt *pUpdate1 = 0;
      sqlite3_stmt *pUpdate2 = 0;

      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL_IDX, &pUpdate1, 0);
      }
      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL, &pUpdate2, 0);
      }

      if( rc==SQLITE_OK ){

        /* Loop through all %_segdir entries for segments in this index with
        ** levels equal to or greater than iAbsLevel. As each entry is visited,
        ** updated it to set (level = -1) and (idx = N), where N is 0 for the
        ** oldest segment in the range, 1 for the next oldest, and so on.
        **
        ** In other words, move all segments being promoted to level -1,
        ** setting the "idx" fields as appropriate to keep them in the same
        ** order. The contents of level -1 (which is never used, except
        ** transiently here), will be moved back to level iAbsLevel below.  */
        sqlite3_bind_int64(pRange, 1, iAbsLevel);
        while( SQLITE_ROW==sqlite3_step(pRange) ){
          sqlite3_bind_int(pUpdate1, 1, iIdx++);
          sqlite3_bind_int(pUpdate1, 2, sqlite3_column_int(pRange, 0));
          sqlite3_bind_int(pUpdate1, 3, sqlite3_column_int(pRange, 1));
          sqlite3_step(pUpdate1);
          rc = sqlite3_reset(pUpdate1);
          if( rc!=SQLITE_OK ){
            sqlite3_reset(pRange);
            break;
          }
        }
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3_reset(pRange);
      }

      /* Move level -1 to level iAbsLevel */
      if( rc==SQLITE_OK ){
        sqlite3_bind_int64(pUpdate2, 1, iAbsLevel);
        sqlite3_step(pUpdate2);
        rc = sqlite3_reset(pUpdate2);
      }
    }
  }


  return rc;
}